

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

string * string_from_abi_cxx11_(llama_context *ctx,llama_batch *batch)

{
  ostream *poVar1;
  int *in_RDX;
  string *in_RDI;
  string detokenized;
  int i;
  bool first;
  stringstream buf;
  ostream *in_stack_fffffffffffffcb8;
  ostream *in_stack_fffffffffffffcc0;
  ostream *in_stack_fffffffffffffcd0;
  ostream *in_stack_fffffffffffffcd8;
  ostream *in_stack_fffffffffffffd08;
  int __val;
  string local_2b8 [32];
  string local_298 [32];
  string local_278 [32];
  string local_258 [32];
  string local_238 [32];
  undefined8 local_218;
  undefined8 local_210;
  undefined8 local_208;
  undefined8 local_1f8;
  undefined8 local_1f0;
  char *local_1e8;
  undefined8 local_1e0;
  string local_1d8 [36];
  int local_1b4;
  byte local_1ad;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  int *local_18;
  
  local_18 = in_RDX;
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::operator<<(local_190,"[ ");
  local_1ad = 1;
  for (local_1b4 = 0; __val = (int)((ulong)in_stack_fffffffffffffd08 >> 0x20), local_1b4 < *local_18
      ; local_1b4 = local_1b4 + 1) {
    if ((local_1ad & 1) == 0) {
      std::operator<<(local_190,", ");
    }
    else {
      local_1ad = 0;
    }
    common_token_to_piece_abi_cxx11_
              ((llama_context *)in_stack_fffffffffffffcd8,
               (llama_token)((ulong)in_stack_fffffffffffffcd0 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffcd0 >> 0x18,0));
    local_1f0 = std::__cxx11::string::begin();
    local_1f8 = std::__cxx11::string::end();
    local_1e8 = (char *)std::
                        remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,string_from(llama_context_const*,llama_batch_const&)::__0>
                                  (local_1f0,local_1f8);
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffffcc0,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffffcb8);
    local_210 = std::__cxx11::string::end();
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffffcc0,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffffcb8);
    local_218 = std::__cxx11::string::erase(local_1d8,local_1e0,local_208);
    poVar1 = std::operator<<(local_190,"\n");
    std::__cxx11::to_string(__val);
    in_stack_fffffffffffffd08 = std::operator<<(poVar1,local_238);
    poVar1 = std::operator<<(in_stack_fffffffffffffd08,", token \'");
    poVar1 = std::operator<<(poVar1,local_1d8);
    poVar1 = std::operator<<(poVar1,"\'");
    poVar1 = std::operator<<(poVar1,", pos ");
    std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffd08 >> 0x20));
    poVar1 = std::operator<<(poVar1,local_258);
    in_stack_fffffffffffffcd8 = std::operator<<(poVar1,", n_seq_id ");
    std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffd08 >> 0x20));
    in_stack_fffffffffffffcd0 = std::operator<<(in_stack_fffffffffffffcd8,local_278);
    poVar1 = std::operator<<(in_stack_fffffffffffffcd0,", seq_id ");
    std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffd08 >> 0x20));
    in_stack_fffffffffffffcc0 = std::operator<<(poVar1,local_298);
    in_stack_fffffffffffffcb8 = std::operator<<(in_stack_fffffffffffffcc0,", logits ");
    std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffd08 >> 0x20));
    std::operator<<(in_stack_fffffffffffffcb8,local_2b8);
    std::__cxx11::string::~string(local_2b8);
    std::__cxx11::string::~string(local_298);
    std::__cxx11::string::~string(local_278);
    std::__cxx11::string::~string(local_258);
    std::__cxx11::string::~string(local_238);
    std::__cxx11::string::~string(local_1d8);
  }
  std::operator<<(local_190," ]");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return in_RDI;
}

Assistant:

std::string string_from(const struct llama_context * ctx, const struct llama_batch & batch) {
    std::stringstream buf;

    buf << "[ ";

    bool first = true;
    for (int i = 0; i < batch.n_tokens; ++i) {
        if (!first) {
            buf << ", ";
        } else {
            first = false;
        }

        auto detokenized = common_token_to_piece(ctx, batch.token[i]);

        detokenized.erase(
                std::remove_if(
                    detokenized.begin(),
                    detokenized.end(),
                    [](const unsigned char c) { return !std::isprint(c); }),
                detokenized.end());

        buf << "\n"          << std::to_string(i)
            << ", token '"   << detokenized << "'"
            << ", pos "      << std::to_string(batch.pos[i])
            << ", n_seq_id " << std::to_string(batch.n_seq_id[i])
            << ", seq_id "   << std::to_string(batch.seq_id[i][0])
            << ", logits "   << std::to_string(batch.logits[i]);
    }

    buf << " ]";

    return buf.str();
}